

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)0>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  int iVar1;
  size_t sVar2;
  pointer pdVar3;
  pointer pdVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  pointer piVar8;
  ulong uVar9;
  pointer piVar10;
  bool bVar11;
  int iVar12;
  int i;
  size_type __n;
  long lVar13;
  int iVar14;
  ulong uVar15;
  pointer pdVar16;
  long lVar17;
  double *pdVar18;
  GridLocalPolynomial *pGVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  size_t sVar23;
  Data2D<int> *pDVar24;
  long lVar25;
  reference rVar26;
  undefined1 local_201;
  Data2D<int> *local_200;
  int local_1f4;
  pointer local_1f0;
  double local_1e8;
  GridLocalPolynomial *local_1e0;
  size_t local_1d8;
  double *local_1d0;
  int local_1c8;
  uint local_1c4;
  long local_1c0;
  pointer local_1b8;
  ulong local_1b0;
  long local_1a8;
  pointer local_1a0;
  int local_194;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  SplitDirections split;
  vector<int,_std::allocator<int>_> levels;
  vector<double,_std::allocator<double>_> default_scale;
  Data2D<int> dagUp;
  
  local_1d8 = CONCAT44(local_1d8._4_4_,criteria);
  uVar21 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)(int)uVar21;
  sVar23 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  dagUp.stride = CONCAT44(dagUp.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_1f4 = output;
  local_1e8 = tolerance;
  local_1d0 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&split.job_directions,sVar23 * __n,(value_type_conflict3 *)&dagUp,
             (allocator_type *)&used);
  piVar10 = split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar23;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&split);
  if ((local_1e8 != 0.0) || (NAN(local_1e8))) {
    local_1a0 = piVar10;
    local_200 = __return_storage_ptr__;
    getNormalization(&norm,this);
    if (local_1f4 == -1) {
      uVar20 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    else {
      uVar20 = 1;
    }
    local_1c0 = (long)(int)uVar20;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0 = this;
    if (local_1d0 == (double *)0x0) {
      dagUp.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&split,local_1c0 * __n,
                 (value_type_conflict2 *)&dagUp,(allocator_type *)&used);
      ::std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)&default_scale,&split);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&split);
      local_1d0 = default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    lVar13 = local_1c0;
    pGVar19 = local_1e0;
    iVar14 = local_1f4;
    local_1a8 = (long)local_1f4;
    if ((uint)local_1d8 < 2) {
      if ((int)uVar21 < 1) {
        uVar21 = 0;
      }
      lVar17 = 0;
      pdVar18 = local_1d0;
      for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
        sVar2 = (local_1e0->surpluses).stride;
        pdVar3 = (local_1e0->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_1f4 == -1) {
          uVar20 = (local_1e0->super_BaseCanonicalGrid).num_outputs;
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = 0;
          }
          bVar11 = true;
          for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
            if (bVar11) {
              bVar11 = (ABS(*(double *)((long)pdVar3 + uVar15 * 8 + sVar2 * lVar17)) *
                       pdVar18[uVar15]) /
                       norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15] <= local_1e8;
            }
            else {
              bVar11 = false;
            }
          }
          if (!bVar11) goto LAB_001ab30b;
        }
        else if (local_1e8 <
                 (ABS(pdVar3[sVar2 * uVar22 + local_1a8]) * local_1d0[uVar22 * local_1c0]) /
                 norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[local_1a8]) {
LAB_001ab30b:
          split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(split.job_directions.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          ::std::__fill_n_a<int*,int,int>
                    (local_1a0 + uVar22 * sVar23,(local_1e0->super_BaseCanonicalGrid).num_dimensions
                     ,&split);
        }
        lVar17 = lVar17 + 8;
        pdVar18 = pdVar18 + lVar13;
      }
    }
    else {
      mset = &(local_1e0->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)0>(&dagUp,mset);
      pDVar24 = local_200;
      HierarchyManipulations::SplitDirections::SplitDirections(&split,mset);
      iVar7 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&split);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&global_to_pnts,__n,(allocator_type *)&used);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&levels,(long)iVar7,(allocator_type *)&used);
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&monkey_count,(long)pGVar19->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&monkey_tail,(long)pGVar19->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&used,(long)iVar7,false);
      local_1a0 = (pointer)(ulong)uVar20;
      if ((int)uVar20 < 1) {
        local_1a0 = (pointer)0x0;
      }
      local_1c4 = uVar20;
      for (lVar13 = 0;
          lVar13 < (int)(((long)split.job_pnts.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          lVar13 = lVar13 + 1) {
        local_1f0 = (pointer)(long)split.job_directions.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar13];
        local_1b8 = split.job_pnts.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar13].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
        uVar22 = (ulong)((long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)local_1b8) >> 2;
        Data2D<double>::Data2D<int,int>(&vals,uVar20,(int)uVar22);
        piVar10 = local_1b8;
        local_1b0 = 0;
        if (0 < (int)uVar22) {
          local_1b0 = uVar22 & 0xffffffff;
        }
        uVar9 = 0;
        if (iVar14 == -1) {
          iVar14 = 0;
          for (; local_1b0 != uVar9; uVar9 = uVar9 + 1) {
            lVar17 = (long)(pGVar19->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar17) {
              memmove(vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + vals.stride * uVar9,
                      (pGVar19->super_BaseCanonicalGrid).values.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (long)piVar10[uVar9] * (pGVar19->super_BaseCanonicalGrid).values.num_outputs,
                      lVar17 << 3);
            }
            global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[piVar10[uVar9]] = (int)uVar9;
            iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)0>
                              ((pGVar19->super_BaseCanonicalGrid).points.indexes.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(long)piVar10[uVar9] *
                                (pGVar19->super_BaseCanonicalGrid).points.num_dimensions +
                                (long)local_1f0]);
            levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9] = iVar7;
            if (iVar14 <= iVar7) {
              iVar14 = iVar7;
            }
          }
        }
        else {
          iVar14 = 0;
          for (; local_1b0 != uVar9; uVar9 = uVar9 + 1) {
            iVar7 = piVar10[uVar9];
            vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[vals.stride * uVar9] =
                 (pGVar19->super_BaseCanonicalGrid).values.values.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(pGVar19->super_BaseCanonicalGrid).values.num_outputs * (long)iVar7 +
                           local_1a8];
            global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7] = (int)uVar9;
            iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)0>
                              ((pGVar19->super_BaseCanonicalGrid).points.indexes.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(long)piVar10[uVar9] *
                                (pGVar19->super_BaseCanonicalGrid).points.num_dimensions +
                                (long)local_1f0]);
            levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9] = iVar7;
            if (iVar14 <= iVar7) {
              iVar14 = iVar7;
            }
          }
        }
        local_1c8 = (int)local_1f0 * 2;
        iVar7 = (int)local_1f0 * 2 + 2;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        local_194 = iVar14 + 1;
        for (iVar12 = 1; pdVar3 = local_1f0, iVar14 = local_1f4, iVar12 != local_194;
            iVar12 = iVar12 + 1) {
          local_1d8 = 0;
          for (uVar9 = 0; piVar10 = local_1b8, uVar9 != local_1b0; uVar9 = uVar9 + 1) {
            if (levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar9] == iVar12) {
              dVar5 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)0>
                                ((local_1e0->super_BaseCanonicalGrid).points.indexes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start
                                 [(long)local_1b8[uVar9] *
                                  (local_1e0->super_BaseCanonicalGrid).points.num_dimensions +
                                  (long)local_1f0]);
              pdVar3 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              sVar23 = vals.stride;
              *monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = local_1c8;
              *monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = piVar10[uVar9];
              local_201 = 0;
              ::std::__fill_n_a<std::_Bit_iterator,int,bool>
                        (used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,uVar22,
                         &local_201);
              lVar17 = sVar23 * local_1d8;
              uVar15 = 0;
              piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                uVar15 = (ulong)(int)uVar15;
                while( true ) {
                  if (iVar7 <= *piVar8) goto LAB_001ab81e;
                  if (piVar8[uVar15] < iVar7) break;
                  uVar15 = uVar15 - 1;
                  piVar8[(int)uVar15] = piVar8[(int)uVar15] + 1;
                }
                iVar14 = dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar15] * dagUp.stride +
                          (long)piVar8[uVar15]];
                lVar25 = (long)iVar14;
                if ((lVar25 == -1) ||
                   (rVar26 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)&used,
                                        (long)global_to_pnts.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar25]),
                   piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, (*rVar26._M_p & rVar26._M_mask) != 0))
                {
                  piVar8[uVar15] = piVar8[uVar15] + 1;
                  pDVar24 = local_200;
                }
                else {
                  dVar6 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)0>
                                    (local_1e0->order,
                                     (local_1e0->super_BaseCanonicalGrid).points.indexes.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start
                                     [(local_1e0->super_BaseCanonicalGrid).points.num_dimensions *
                                      lVar25 + (long)local_1f0],dVar5);
                  iVar1 = global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar25];
                  for (piVar10 = (pointer)0x0; local_1a0 != piVar10;
                      piVar10 = (pointer)((long)piVar10 + 1)) {
                    *(double *)((long)pdVar3 + (long)piVar10 * 8 + lVar17) =
                         vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)(vals.stride * (long)iVar1 + (long)piVar10)] * -dVar6 +
                         *(double *)((long)pdVar3 + (long)piVar10 * 8 + lVar17);
                  }
                  rVar26 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&used,(long)iVar1);
                  *rVar26._M_p = *rVar26._M_p | rVar26._M_mask;
                  uVar21 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar21;
                  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar21] = local_1c8;
                  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar21] = iVar14;
                  piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pDVar24 = local_200;
                }
              } while( true );
            }
LAB_001ab81e:
            local_1d8 = local_1d8 + 8;
            uVar20 = local_1c4;
          }
          pGVar19 = local_1e0;
        }
        sVar23 = (pGVar19->surpluses).stride;
        pdVar4 = (pGVar19->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar10 = (pDVar24->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar2 = pDVar24->stride;
        local_1d8 = vals.stride;
        local_1f0 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pdVar16 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar22 = 0; uVar22 != local_1b0; uVar22 = uVar22 + 1) {
          lVar25 = (long)local_1b8[uVar22];
          lVar17 = sVar23 * lVar25;
          if (local_1f4 == -1) {
            uVar21 = (pGVar19->super_BaseCanonicalGrid).num_outputs;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            bVar11 = true;
            for (uVar9 = 0; pGVar19 = local_1e0, uVar21 != uVar9; uVar9 = uVar9 + 1) {
              if (bVar11 == false) {
                bVar11 = false;
              }
              else {
                dVar5 = (local_1d0 + lVar25 * local_1c0)[uVar9];
                bVar11 = true;
                if (local_1e8 <
                    (ABS(pdVar4[lVar17 + uVar9]) * dVar5) /
                    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9]) {
                  bVar11 = (dVar5 * ABS(pdVar16[uVar9])) /
                           norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar9] <= local_1e8;
                }
              }
            }
          }
          else {
            dVar5 = local_1d0[lVar25 * local_1c0];
            bVar11 = true;
            if (local_1e8 <
                (ABS(pdVar4[lVar17 + local_1a8]) * dVar5) /
                norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_1a8]) {
              bVar11 = (dVar5 * ABS(vals.vec.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[vals.stride * uVar22]))
                       / norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[local_1a8] <= local_1e8;
            }
          }
          piVar10[(long)pdVar3 + lVar25 * sVar2] = (uint)(bVar11 ^ 1);
          pdVar16 = pdVar16 + vals.stride;
          pDVar24 = local_200;
          uVar20 = local_1c4;
        }
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&vals.vec.super__Vector_base<double,_std::allocator<double>_>);
      }
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&used);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&levels);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&global_to_pnts);
      HierarchyManipulations::SplitDirections::~SplitDirections(&split);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dagUp.vec.super__Vector_base<int,_std::allocator<int>_>);
    }
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&default_scale);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&norm);
    __return_storage_ptr__ = local_200;
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}